

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLRSAPrivateKey.cpp
# Opt level: O2

void __thiscall OSSLRSAPrivateKey::~OSSLRSAPrivateKey(OSSLRSAPrivateKey *this)

{
  *(undefined ***)&this->super_RSAPrivateKey = &PTR_serialise_0014e9f0;
  RSA_free((RSA *)this->rsa);
  RSAPrivateKey::~RSAPrivateKey(&this->super_RSAPrivateKey);
  return;
}

Assistant:

OSSLRSAPrivateKey::~OSSLRSAPrivateKey()
{
	RSA_free(rsa);
}